

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall
ON_PlaneSurface::Evaluate
          (ON_PlaneSurface *this,double s,double t,int der_count,int v_stride,double *v,int side,
          int *hint)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  undefined1 local_68 [8];
  ON_3dPoint P;
  double dt;
  double ds;
  int *hint_local;
  int side_local;
  double *v_local;
  int v_stride_local;
  int der_count_local;
  double t_local;
  double s_local;
  ON_PlaneSurface *this_local;
  
  dt = 1.0;
  P.z = 1.0;
  bVar1 = ON_Interval::operator!=((ON_Interval *)&this->field_0xb0,(ON_Interval *)&this->field_0x90)
  ;
  t_local = s;
  if (bVar1) {
    dVar3 = ON_Interval::NormalizedParameterAt((ON_Interval *)&this->field_0x90,s);
    t_local = ON_Interval::ParameterAt((ON_Interval *)&this->field_0xb0,dVar3);
    dVar3 = ON_Interval::Length((ON_Interval *)&this->field_0xb0);
    dVar4 = ON_Interval::Length((ON_Interval *)&this->field_0x90);
    dt = dVar3 / dVar4;
  }
  bVar1 = ON_Interval::operator!=((ON_Interval *)&this->field_0xc0,(ON_Interval *)&this->field_0xa0)
  ;
  _v_stride_local = t;
  if (bVar1) {
    dVar3 = ON_Interval::NormalizedParameterAt((ON_Interval *)&this->field_0xa0,t);
    _v_stride_local = ON_Interval::ParameterAt((ON_Interval *)&this->field_0xc0,dVar3);
    dVar3 = ON_Interval::Length((ON_Interval *)&this->field_0xc0);
    dVar4 = ON_Interval::Length((ON_Interval *)&this->field_0xa0);
    P.z = dVar3 / dVar4;
  }
  ON_Plane::PointAt((ON_3dPoint *)local_68,&this->m_plane,t_local,_v_stride_local);
  *v = (double)local_68;
  v[1] = P.x;
  v[2] = P.y;
  pdVar2 = v + v_stride;
  if (0 < der_count) {
    *pdVar2 = dt * (this->m_plane).xaxis.x;
    pdVar2[1] = dt * (this->m_plane).xaxis.y;
    pdVar2[2] = dt * (this->m_plane).xaxis.z;
    pdVar2 = pdVar2 + v_stride;
    *pdVar2 = P.z * (this->m_plane).yaxis.x;
    pdVar2[1] = P.z * (this->m_plane).yaxis.y;
    pdVar2[2] = P.z * (this->m_plane).yaxis.z;
    if (1 < der_count) {
      memset(pdVar2 + v_stride,0,
             (long)((((der_count + 1) * (der_count + 2)) / 2 + -4) * v_stride + 3) << 3);
    }
  }
  return true;
}

Assistant:

bool 
ON_PlaneSurface::Evaluate( // returns false if unable to evaluate
       double s, double t, // evaluation parameters
       int der_count,  // number of derivatives (>=0)
       int v_stride,   // v[] array stride (>=Dimension())
       double* v,      // v[] array of length stride*(ndir+1)
       int side,       // optional - determines which side to evaluate from
                       //         0 = default
                       //      <  0 to evaluate from below, 
                       //      >  0 to evaluate from above
       int* hint       // optional - evaluation hint (int) used to speed
                       //            repeated evaluations
       ) const
{
  double ds = 1.0;
  double dt = 1.0;
  if ( m_extents[0] != m_domain[0] )
  {
    s = m_extents[0].ParameterAt( m_domain[0].NormalizedParameterAt(s) );
    ds = m_extents[0].Length()/m_domain[0].Length();
  }
  if ( m_extents[1] != m_domain[1] )
  {
    t = m_extents[1].ParameterAt( m_domain[1].NormalizedParameterAt(t) );
    dt = m_extents[1].Length()/m_domain[1].Length();
  }
  ON_3dPoint P = m_plane.PointAt( s, t );
  v[0] = P.x;
  v[1] = P.y;
  v[2] = P.z;
  v += v_stride;
  if ( der_count >= 1 ) 
  {
    v[0] = ds*m_plane.xaxis.x;
    v[1] = ds*m_plane.xaxis.y;
    v[2] = ds*m_plane.xaxis.z;
    v += v_stride;

    v[0] = dt*m_plane.yaxis.x;
    v[1] = dt*m_plane.yaxis.y;
    v[2] = dt*m_plane.yaxis.z;
    v += v_stride;

    if ( der_count > 1 ) 
    {
      // zero higher partials
      memset( v, 0, (((der_count+1)*(der_count+2)/2-4)*v_stride+3)*sizeof(*v) );
    }
  }
  return true;
}